

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_signal.cpp
# Opt level: O0

int main(void)

{
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  int __sig;
  slot_base **this;
  undefined1 local_90 [8];
  A a;
  signal<void_()> signal;
  
  this = &a.m_conn.m_slot;
  obs::signal<void_()>::signal((signal<void_()> *)this,in_ESI,in_RDX);
  A::A((A *)local_90,(signal<void_()> *)this);
  __sig = (int)this;
  obs::signal<void_()>::operator()<>((signal<void_()> *)&a.m_conn.m_slot);
  obs::signal<void_()>::operator()<>((signal<void_()> *)&a.m_conn.m_slot);
  obs::signal<void_()>::~signal((signal<void_()> *)&a.m_conn.m_slot,__sig,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  {
    A a(signal);
    signal();
  }
  signal();
}